

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_celsius.cc
# Opt level: O0

void __thiscall hwtest::pgraph::MthdCelsiusLightEnable::emulate_mthd(MthdCelsiusLightEnable *this)

{
  uint32_t local_14;
  uint32_t err;
  MthdCelsiusLightEnable *this_local;
  
  local_14 = 0;
  if ((long)((ulong)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_config_c
            << 0x37) < 0) {
    local_14 = 4;
  }
  if (local_14 == 0) {
    if ((-1 < (long)((ulong)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource
                    << 0x3e)) &&
       ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_xf_misc_a =
             (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_xf_misc_a &
             0xffff0000 | (this->super_SingleMthdTest).super_MthdTest.val & 0xffff,
       -1 < (long)((ulong)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.debug_d <<
                  0x23))) {
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_junk[2] =
           (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_xf_misc_a;
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_junk[3] =
           (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_xf_misc_b;
    }
  }
  else {
    MthdTest::warn((MthdTest *)this,local_14);
  }
  return;
}

Assistant:

void emulate_mthd() override {
		uint32_t err = 0;
		if (extr(exp.celsius_config_c, 8, 1))
			err |= 4;
		if (err) {
			warn(err);
		} else {
			if (!extr(exp.nsource, 1, 1)) {
				insrt(exp.celsius_xf_misc_a, 0, 16, val);
				if (!extr(exp.debug_d, 28, 1)) {
					exp.celsius_pipe_junk[2] = exp.celsius_xf_misc_a;
					exp.celsius_pipe_junk[3] = exp.celsius_xf_misc_b;
				}
			}
		}
	}